

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

bool __thiscall tcu::CommandLine::parse(CommandLine *this,string *cmdLine)

{
  bool bVar1;
  deCommandLine *cmdLine_00;
  undefined8 *puVar2;
  
  cmdLine_00 = deCommandLine_parse((cmdLine->_M_dataplus)._M_p);
  if (cmdLine_00 != (deCommandLine *)0x0) {
    bVar1 = parse(this,cmdLine_00->numArgs,cmdLine_00->args);
    deCommandLine_destroy(cmdLine_00);
    return bVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = time;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

bool CommandLine::parse (const std::string& cmdLine)
{
	deCommandLine* parsedCmdLine = deCommandLine_parse(cmdLine.c_str());
	if (!parsedCmdLine)
		throw std::bad_alloc();

	bool isOk = false;
	try
	{
		isOk = parse(parsedCmdLine->numArgs, parsedCmdLine->args);
	}
	catch (...)
	{
		deCommandLine_destroy(parsedCmdLine);
		throw;
	}

	deCommandLine_destroy(parsedCmdLine);
	return isOk;
}